

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_51301::RegexExpr<wchar_t>::parse(RegexExpr<wchar_t> *this,Context *con)

{
  ParserPosition *pPVar1;
  iterator *piVar2;
  Index *pIVar3;
  int *piVar4;
  Input *pIVar5;
  Index IVar6;
  Input *pIVar7;
  Input *pIVar8;
  element_type *peVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  iterator __begin;
  iterator __end;
  iterator __begin_00;
  iterator __end_00;
  pointer psVar13;
  int iVar14;
  bool bVar15;
  sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
  *__it;
  _Base_type *__range3;
  pointer psVar16;
  Index IVar17;
  long lVar18;
  long lVar19;
  vector<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
  local_118;
  Input *local_100;
  Index local_f8;
  Input *local_e8;
  Index local_e0;
  _Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_false>
  __executor;
  
  pPVar1 = &con->position;
  pIVar5 = (pPVar1->it).buffer;
  IVar6 = (con->position).it.idx;
  __begin_00 = pPVar1->it;
  __begin = pPVar1->it;
  piVar2 = &con->finish;
  pIVar7 = piVar2->buffer;
  pIVar8 = (Input *)(con->finish).idx;
  __end_00 = *piVar2;
  __end = *piVar2;
  local_118.
  super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peVar9 = (this->r)._M_automaton.
           super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<wchar_t>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar9 == (element_type *)0x0) goto LAB_0012e5c5;
  __executor._M_cur_results.
  super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  __executor._M_cur_results.
  super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xffffffffffffffff;
  __executor._M_cur_results.
  super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __executor._M_current.s.buffer = (Input *)0xffffffffffffffff;
  __executor._M_current.s.idx._0_4_ = (uint)__executor._M_current.s.idx & 0xffffff00;
  local_100 = pIVar5;
  local_f8 = IVar6;
  std::
  vector<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
  ::assign(&local_118,(ulong)((int)(peVar9->super__NFA_base)._M_subexpr_count + 3),
           (value_type *)&__executor);
  local_e8 = pIVar5;
  local_e0 = IVar6;
  if (((this->r)._M_flags & 0x400) == 0) {
    std::__detail::
    _Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_true>
    ::_Executor((_Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_true>
                 *)&__executor,
                (IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>)__begin,
                (IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>)__end,&local_118,
                &this->r,0x40);
    __executor._M_current.s.idx._0_4_ = (undefined4)__executor._M_begin.s.idx;
    __executor._M_current.s.idx._4_4_ = __executor._M_begin.s.idx._4_4_;
    bVar15 = std::__detail::
             _Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_true>
             ::_M_main_dispatch();
    bVar12 = true;
    if (!bVar15) {
      if (((ulong)__executor._M_states._M_visited_states._M_t.
                  super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                  super__Head_base<0UL,_bool_*,_false>._M_head_impl & 0x40) == 0) {
        __executor._M_states._M_visited_states._M_t.
        super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
        super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
        super__Head_base<0UL,_bool_*,_false>._M_head_impl =
             (__uniq_ptr_data<bool,_std::default_delete<bool[]>,_true,_true>)
             ((ulong)__executor._M_states._M_visited_states._M_t.
                     super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                     super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                     super__Head_base<0UL,_bool_*,_false>._M_head_impl | 0x80);
        do {
          bVar15 = (Input *)CONCAT44(__executor._M_begin.s.buffer._4_4_,
                                     __executor._M_begin.s.buffer._0_4_) ==
                   __executor._M_end.s.buffer;
          bVar12 = __executor._M_end.s.idx != __executor._M_begin.s.idx || !bVar15;
          if (__executor._M_end.s.idx == __executor._M_begin.s.idx && bVar15) break;
          __executor._M_begin.s.idx = __executor._M_begin.s.idx + 1;
          __executor._M_current.s.idx = __executor._M_begin.s.idx;
          bVar15 = std::__detail::
                   _Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_true>
                   ::_M_main_dispatch((_Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_true>
                                       *)&__executor);
        } while (!bVar15);
      }
      else {
        bVar12 = false;
      }
    }
    if (__executor._M_rep_count.
        super__Vector_base<std::pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_int>,_std::allocator<std::pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(__executor._M_rep_count.
                      super__Vector_base<std::pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_int>,_std::allocator<std::pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)__executor._M_rep_count.
                            super__Vector_base<std::pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_int>,_std::allocator<std::pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)__executor._M_rep_count.
                            super__Vector_base<std::pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_int>,_std::allocator<std::pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (__executor._M_cur_results.
        super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(__executor._M_cur_results.
                      super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)__executor._M_cur_results.
                            super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)__executor._M_cur_results.
                            super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    IVar6 = __executor._M_current.s.idx;
    psVar16 = local_118.
              super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar13 = local_118.
              super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    IVar17 = local_e0;
    if (bVar12) {
joined_r0x0012e664:
      for (; psVar16 !=
             local_118.
             super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; psVar16 = psVar16 + 1) {
        if (psVar16->matched == false) {
          (psVar16->
          super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
          ).second.s.buffer = pIVar7;
          (psVar16->
          super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
          ).second.s.idx = (Index)pIVar8;
          (psVar16->
          super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
          ).first.s.buffer =
               (psVar16->
               super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
               ).second.s.buffer;
          (psVar16->
          super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
          ).first.s.idx =
               (psVar16->
               super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
               ).second.s.idx;
        }
        psVar13 = local_118.
                  super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      psVar13[-2].
      super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
      .first.s.buffer = local_e8;
      psVar13[-2].
      super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
      .first.s.idx = IVar17;
      IVar6 = ((local_118.
                super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
              ).first.s.idx;
      psVar13[-2].
      super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
      .second.s.buffer =
           ((local_118.
             super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
           ).first.s.buffer;
      psVar13[-2].
      super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
      .second.s.idx = IVar6;
      psVar13[-2].matched =
           IVar17 != psVar13[-2].
                     super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
                     .second.s.idx ||
           local_e8 !=
           psVar13[-2].
           super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
           .second.s.buffer;
      IVar6 = ((local_118.
                super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
              ).second.s.idx;
      psVar13[-1].
      super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
      .first.s.buffer =
           ((local_118.
             super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
           ).second.s.buffer;
      psVar13[-1].
      super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
      .first.s.idx = IVar6;
      psVar13[-1].
      super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
      .second.s.buffer = pIVar7;
      psVar13[-1].
      super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
      .second.s.idx = (Index)pIVar8;
      psVar13[-1].matched =
           pIVar8 != (Input *)psVar13[-1].
                              super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
                              .first.s.idx ||
           pIVar7 != psVar13[-1].
                     super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
                     .first.s.buffer;
      psVar16 = local_118.
                super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((long)local_118.
                super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_118.
                super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x78) {
        psVar16 = local_118.
                  super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -3;
      }
      if (local_118.
          super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_118.
          super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        psVar16 = local_118.
                  super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -3;
      }
      if (psVar16->matched == true) {
        pIVar5 = (psVar16->
                 super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
                 ).first.s.buffer;
        uVar10 = (psVar16->
                 super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
                 ).first.s.idx;
        pIVar7 = (psVar16->
                 super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
                 ).second.s.buffer;
        uVar11 = (psVar16->
                 super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
                 ).second.s.idx;
        if (uVar10 != uVar11 || pIVar5 != pIVar7) {
          lVar19 = 0;
          do {
            do {
              lVar18 = lVar19;
              lVar19 = lVar18 + 1;
            } while (pIVar5 != pIVar7);
          } while (~uVar10 + uVar11 != lVar18);
          goto LAB_0012e74b;
        }
      }
      lVar19 = 0;
LAB_0012e74b:
      if (local_118.
          super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.
                        super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_118.
                              super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.
                              super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pIVar3 = &(con->position).it.idx;
      *pIVar3 = *pIVar3 + lVar19;
      piVar4 = &(con->position).col;
      *piVar4 = *piVar4 + (int)lVar19;
      return true;
    }
  }
  else {
    std::__detail::
    _Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_false>
    ::_Executor(&__executor,
                (IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>)__begin_00,
                (IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>)__end_00,&local_118,
                &this->r,0x40);
    __executor._M_current.s.idx._0_4_ = (undefined4)__executor._M_begin.s.idx;
    __executor._M_current.s.idx._4_4_ = __executor._M_begin.s.idx._4_4_;
    bVar15 = std::__detail::
             _Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_false>
             ::_M_main_dispatch();
    bVar12 = true;
    if (!bVar15) {
      if ((__executor._M_flags & 0x40) == 0) {
        __executor._M_flags = __executor._M_flags | 0x80;
        do {
          bVar15 = (Input *)CONCAT44(__executor._M_begin.s.buffer._4_4_,
                                     __executor._M_begin.s.buffer._0_4_) ==
                   __executor._M_end.s.buffer;
          bVar12 = __executor._M_end.s.idx != __executor._M_begin.s.idx || !bVar15;
          if (__executor._M_end.s.idx == __executor._M_begin.s.idx && bVar15) break;
          __executor._M_begin.s.idx = __executor._M_begin.s.idx + 1;
          __executor._M_current.s.idx = __executor._M_begin.s.idx;
          bVar15 = std::__detail::
                   _Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_false>
                   ::_M_main_dispatch(&__executor);
        } while (!bVar15);
      }
      else {
        bVar12 = false;
      }
    }
    if ((__uniq_ptr_impl<bool,_std::default_delete<bool[]>_>)
        __executor._M_states._M_visited_states._M_t.
        super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
        super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
        super__Head_base<0UL,_bool_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<bool,_std::default_delete<bool[]>_>)0x0) {
      operator_delete__((void *)__executor._M_states._M_visited_states._M_t.
                                super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                                super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                                super__Head_base<0UL,_bool_*,_false>._M_head_impl);
    }
    __executor._M_states._M_visited_states._M_t.
    super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
    super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
    super__Head_base<0UL,_bool_*,_false>._M_head_impl =
         (__uniq_ptr_data<bool,_std::default_delete<bool[]>,_true,_true>)
         (__uniq_ptr_impl<bool,_std::default_delete<bool[]>_>)0x0;
    std::
    vector<std::pair<long,_std::vector<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>_>,_std::allocator<std::pair<long,_std::vector<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>_>_>_>
    ::~vector(&__executor._M_states._M_match_queue);
    if (__executor._M_rep_count.
        super__Vector_base<std::pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_int>,_std::allocator<std::pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(__executor._M_rep_count.
                      super__Vector_base<std::pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_int>,_std::allocator<std::pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)__executor._M_rep_count.
                            super__Vector_base<std::pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_int>,_std::allocator<std::pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)__executor._M_rep_count.
                            super__Vector_base<std::pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_int>,_std::allocator<std::pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    IVar17 = local_e0;
    IVar6 = __executor._M_current.s.idx;
    if (__executor._M_cur_results.
        super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(__executor._M_cur_results.
                      super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)__executor._M_cur_results.
                            super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)__executor._M_cur_results.
                            super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      IVar6 = __executor._M_current.s.idx;
    }
    psVar16 = local_118.
              super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar13 = local_118.
              super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __executor._M_current.s.idx = IVar6;
    if (bVar12) goto joined_r0x0012e664;
  }
  __executor._M_current.s.idx._4_4_ = (undefined4)(IVar6 >> 0x20);
  __executor._M_current.s.idx._0_4_ = (uint)IVar6;
  __executor._M_current.s.idx._0_4_ = (uint)__executor._M_current.s.idx & 0xffffff00;
  __executor._M_cur_results.
  super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pIVar7;
  __executor._M_cur_results.
  super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pIVar8;
  __executor._M_cur_results.
  super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pIVar7;
  __executor._M_current.s.buffer = pIVar8;
  std::
  vector<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
  ::assign(&local_118,3,(value_type *)&__executor);
  if (local_118.
      super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.
                    super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_0012e5c5:
  if ((con->error_pos).it.idx < (con->position).it.idx) {
    iVar14 = (con->position).col;
    (con->error_pos).line = (con->position).line;
    (con->error_pos).col = iVar14;
    IVar6 = (con->position).it.idx;
    (con->error_pos).it.buffer = (con->position).it.buffer;
    (con->error_pos).it.idx = IVar6;
  }
  return false;
}

Assistant:

bool parse(Context &con) const
	{
		size_t length;
		if (regexMatch(con.position.it, con.finish, r, length))
		{
			con.consume(length);
			return true;
		}
		con.set_error_pos();
		return false;
	}